

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.h
# Opt level: O0

Coordinate * __thiscall Coordinate::representation_abi_cxx11_(Coordinate *this)

{
  int *in_RSI;
  __cxx11 local_c8 [48];
  __cxx11 local_98 [32];
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  Coordinate *this_local;
  
  this_local = this;
  std::__cxx11::to_string(local_98,*in_RSI);
  std::operator+((char *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
  std::operator+(local_58,(char *)local_78);
  std::__cxx11::to_string(local_c8,in_RSI[1]);
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)local_98);
  return this;
}

Assistant:

std::string representation(){
        return "(" + std::to_string(x) + "," + std::to_string(y) + ")";
    }